

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeamData.cpp
# Opt level: O3

int __thiscall DIS::BeamData::getMarshalledSize(BeamData *this)

{
  return 0x14;
}

Assistant:

int BeamData::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = marshalSize + 4;  // _beamAzimuthCenter
   marshalSize = marshalSize + 4;  // _beamAzimuthSweep
   marshalSize = marshalSize + 4;  // _beamElevationCenter
   marshalSize = marshalSize + 4;  // _beamElevationSweep
   marshalSize = marshalSize + 4;  // _beamSweepSync
    return marshalSize;
}